

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * tinyusdz::print_customData
                   (string *__return_storage_ptr__,CustomDataType *customData,string *dict_name,
                   uint32_t indent)

{
  string *this;
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  uint32_t n;
  uint32_t n_00;
  string local_298;
  string local_278;
  reference local_258;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>
  *item;
  const_iterator __end1;
  const_iterator __begin1;
  CustomDataType *__range1;
  string local_230;
  string local_210;
  undefined1 local_1f0 [8];
  string name;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream aoStack_1a0 [380];
  uint local_24;
  string *psStack_20;
  uint32_t indent_local;
  string *dict_name_local;
  CustomDataType *customData_local;
  
  local_24 = indent;
  psStack_20 = dict_name;
  dict_name_local = (string *)customData;
  customData_local = (CustomDataType *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b0);
  pprint::Indent_abi_cxx11_((string *)((long)&name.field_2 + 8),(pprint *)(ulong)local_24,n);
  std::operator<<(aoStack_1a0,(string *)(name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)local_1f0,(string *)psStack_20);
    bVar1 = isValidIdentifier((string *)local_1f0,true);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_230,"\"",(allocator *)((long)&__range1 + 7));
      quote(&local_210,(string *)local_1f0,&local_230);
      std::__cxx11::string::operator=((string *)local_1f0,(string *)&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_230);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    }
    poVar3 = std::operator<<(aoStack_1a0,(string *)local_1f0);
    std::operator<<(poVar3," = {\n");
    std::__cxx11::string::~string((string *)local_1f0);
  }
  else {
    std::operator<<(aoStack_1a0,"{\n");
  }
  this = dict_name_local;
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                    *)dict_name_local);
  item = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
            ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                   *)this);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&item);
    if (!bVar1) break;
    local_258 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>
                ::operator*(&__end1);
    print_meta(&local_278,&local_258->second,local_24 + 1,true,&local_258->first);
    std::operator<<(aoStack_1a0,(string *)&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>
    ::operator++(&__end1);
  }
  pprint::Indent_abi_cxx11_(&local_298,(pprint *)(ulong)local_24,n_00);
  poVar3 = std::operator<<(aoStack_1a0,(string *)&local_298);
  std::operator<<(poVar3,"}\n");
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string print_customData(const CustomDataType &customData,
                             const std::string &dict_name,
                             const uint32_t indent) {
  std::stringstream ss;

  ss << pprint::Indent(indent);
  if (!dict_name.empty()) {
    std::string name = dict_name;

    if (!isValidIdentifier(name)) {
      // May contain "/", quote it
      name = quote(name);
    }

    ss << name << " = {\n";
  } else {
    ss << "{\n";
  }
  for (const auto &item : customData) {
    ss << print_meta(item.second, indent + 1, true, item.first);
  }
  ss << pprint::Indent(indent) << "}\n";

  return ss.str();
}